

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argv_parser.h
# Opt level: O2

void __thiscall args_t::~args_t(args_t *this)

{
  char **ppcVar1;
  int i;
  long lVar2;
  
  for (lVar2 = 0; ppcVar1 = this->argv, lVar2 < this->argc; lVar2 = lVar2 + 1) {
    if (ppcVar1[lVar2] != (char *)0x0) {
      operator_delete__(ppcVar1[lVar2]);
    }
  }
  if (ppcVar1 != (char **)0x0) {
    operator_delete__(ppcVar1);
    return;
  }
  return;
}

Assistant:

~args_t() {
        for (int i = 0; i < argc; i++) {
            delete[] argv[i];
        }
        delete[] argv;
    }